

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,undefined8 param_3,
                         undefined8 param_4,String *param_5)

{
  char *pcVar1;
  size_t sVar2;
  String local_48;
  String local_28;
  
  BTreeImpl::MaybeUint::toString(&local_28,(MaybeUint *)*param_2);
  BTreeImpl::MaybeUint::toString(&local_48,(MaybeUint *)param_2[1]);
  concat<kj::String,kj::StringPtr&,kj::String>
            (__return_storage_ptr__,(_ *)&local_28,(String *)(param_2 + 2),(StringPtr *)&local_48,
             param_5);
  sVar2 = local_48.content.size_;
  pcVar1 = local_48.content.ptr;
  if (local_48.content.ptr != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    (**(local_48.content.disposer)->_vptr_ArrayDisposer)
              (local_48.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_28.content.size_;
  pcVar1 = local_28.content.ptr;
  if (local_28.content.ptr != (char *)0x0) {
    local_28.content.ptr = (char *)0x0;
    local_28.content.size_ = 0;
    (**(local_28.content.disposer)->_vptr_ArrayDisposer)
              (local_28.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}